

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall
CGameContext::CreateDamage
          (CGameContext *this,vec2 Pos,int Id,vec2 Source,int HealthAmount,int ArmorAmount,bool Self
          )

{
  long lVar1;
  int *piVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar3;
  float in_XMM0_Db;
  CNetEvent_Damage *pEvent;
  float f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fVar3 = angle((vector2_base<float> *)0x11f5bf);
  piVar2 = (int *)CEventHandler::Create((CEventHandler *)(in_RDI + 0x510),0x16,0x1c,-1);
  if (piVar2 != (int *)0x0) {
    *piVar2 = (int)in_XMM0_Da;
    piVar2[1] = (int)in_XMM0_Db;
    piVar2[2] = in_ESI;
    piVar2[3] = (int)(fVar3 * 256.0);
    piVar2[4] = in_EDX;
    piVar2[5] = in_ECX;
    piVar2[6] = (uint)(in_R8B & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::CreateDamage(vec2 Pos, int Id, vec2 Source, int HealthAmount, int ArmorAmount, bool Self)
{
	float f = angle(Source);
	CNetEvent_Damage *pEvent = (CNetEvent_Damage *)m_Events.Create(NETEVENTTYPE_DAMAGE, sizeof(CNetEvent_Damage));
	if(pEvent)
	{
		pEvent->m_X = (int)Pos.x;
		pEvent->m_Y = (int)Pos.y;
		pEvent->m_ClientID = Id;
		pEvent->m_Angle = (int)(f*256.0f);
		pEvent->m_HealthAmount = HealthAmount;
		pEvent->m_ArmorAmount = ArmorAmount;
		pEvent->m_Self = Self;
	}
}